

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O3

bool Assimp::PLY::DOM::ParseInstanceBinary
               (IOStreamBuffer<char> *streamBuffer,DOM *p_pcOut,PLYImporter *loader,bool p_bBE)

{
  Logger *pLVar1;
  vector<char,_std::allocator<char>_> buffer;
  uint bufferSize;
  char *pCur;
  vector<char,_std::allocator<char>_> local_48;
  uint local_2c;
  pointer local_28;
  
  if (p_pcOut == (DOM *)0x0) {
    __assert_fail("__null != p_pcOut",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Ply/PlyParser.cpp"
                  ,0x264,
                  "static bool Assimp::PLY::DOM::ParseInstanceBinary(IOStreamBuffer<char> &, DOM *, PLYImporter *, bool)"
                 );
  }
  if (loader != (PLYImporter *)0x0) {
    local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    IOStreamBuffer<char>::getNextLine(streamBuffer,&local_48);
    pLVar1 = DefaultLogger::get();
    Logger::debug(pLVar1,"PLY::DOM::ParseInstanceBinary() begin");
    ParseHeader(p_pcOut,streamBuffer,&local_48,true);
    IOStreamBuffer<char>::getNextBlock(streamBuffer,&local_48);
    local_2c = (int)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
               (int)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
    local_28 = local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
    ParseElementInstanceListsBinary(p_pcOut,streamBuffer,&local_48,&local_28,&local_2c,loader,p_bBE)
    ;
    pLVar1 = DefaultLogger::get();
    Logger::debug(pLVar1,"PLY::DOM::ParseInstanceBinary() succeeded");
    if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return true;
  }
  __assert_fail("__null != loader",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Ply/PlyParser.cpp"
                ,0x265,
                "static bool Assimp::PLY::DOM::ParseInstanceBinary(IOStreamBuffer<char> &, DOM *, PLYImporter *, bool)"
               );
}

Assistant:

bool PLY::DOM::ParseInstanceBinary(IOStreamBuffer<char> &streamBuffer, DOM* p_pcOut, PLYImporter* loader, bool p_bBE)
{
  ai_assert(NULL != p_pcOut);
  ai_assert(NULL != loader);

  std::vector<char> buffer;
  streamBuffer.getNextLine(buffer);

  ASSIMP_LOG_DEBUG("PLY::DOM::ParseInstanceBinary() begin");

  if (!p_pcOut->ParseHeader(streamBuffer, buffer, true))
  {
      ASSIMP_LOG_DEBUG("PLY::DOM::ParseInstanceBinary() failure");
    return false;
  }

  streamBuffer.getNextBlock(buffer);
  unsigned int bufferSize = static_cast<unsigned int>(buffer.size());
  const char* pCur = (char*)&buffer[0];
  if (!p_pcOut->ParseElementInstanceListsBinary(streamBuffer, buffer, pCur, bufferSize, loader, p_bBE))
  {
      ASSIMP_LOG_DEBUG("PLY::DOM::ParseInstanceBinary() failure");
    return false;
  }
  ASSIMP_LOG_DEBUG("PLY::DOM::ParseInstanceBinary() succeeded");
  return true;
}